

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::handleIndexLimits
          (TParseContext *this,TSourceLoc *param_1,TIntermTyped *base,TIntermTyped *index)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TQualifier *pTVar4;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TIntermTyped *local_28;
  TIntermTyped *index_local;
  TIntermTyped *base_local;
  TSourceLoc *param_1_local;
  TParseContext *this_local;
  
  local_28 = index;
  index_local = base;
  base_local = (TIntermTyped *)param_1;
  param_1_local = (TSourceLoc *)this;
  if (((this->limits->generalSamplerIndexing & 1U) == 0) &&
     (iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar2 == 0xe))
  goto LAB_00680d70;
  if ((this->limits->generalUniformIndexing & 1U) == 0) {
    iVar2 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x21])();
    bVar1 = TQualifier::isUniformOrBuffer((TQualifier *)CONCAT44(extraout_var,iVar2));
    if ((bVar1) && ((this->super_TParseContextBase).super_TParseVersions.language != EShLangVertex))
    goto LAB_00680d70;
  }
  if ((this->limits->generalAttributeMatrixVectorIndexing & 1U) == 0) {
    iVar2 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x21])();
    bVar1 = TQualifier::isPipeInput((TQualifier *)CONCAT44(extraout_var_00,iVar2));
    if ((bVar1) && ((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex))
    {
      iVar2 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0xe0))();
      if ((uVar3 & 1) != 0) goto LAB_00680d70;
      iVar2 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0xd8))();
      if ((uVar3 & 1) != 0) goto LAB_00680d70;
    }
  }
  if (((this->limits->generalConstantMatrixVectorIndexing & 1U) != 0) ||
     (iVar2 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[5])(),
     CONCAT44(extraout_var_03,iVar2) == 0)) {
    if ((this->limits->generalVariableIndexing & 1U) == 0) {
      iVar2 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      pTVar4 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x58))();
      bVar1 = TQualifier::isUniformOrBuffer(pTVar4);
      if (!bVar1) {
        iVar2 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        pTVar4 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0x58))();
        bVar1 = TQualifier::isPipeInput(pTVar4);
        if (!bVar1) {
          iVar2 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          pTVar4 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar2) + 0x58))();
          bVar1 = TQualifier::isPipeOutput(pTVar4);
          if (!bVar1) {
            iVar2 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            pTVar4 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar2) + 0x58))();
            bVar1 = TQualifier::isConstant(pTVar4);
            if (!bVar1) goto LAB_00680d70;
          }
        }
      }
    }
    if ((this->limits->generalVaryingIndexing & 1U) != 0) {
      return;
    }
    iVar2 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    pTVar4 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar2) + 0x58))();
    bVar1 = TQualifier::isPipeInput(pTVar4);
    if (!bVar1) {
      iVar2 = (*(index_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      pTVar4 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_09,iVar2) + 0x58))();
      bVar1 = TQualifier::isPipeOutput(pTVar4);
      if (!bVar1) {
        return;
      }
    }
  }
LAB_00680d70:
  std::vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>::push_back
            (&(this->needsIndexLimitationChecking).
              super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
             ,&local_28);
  return;
}

Assistant:

void TParseContext::handleIndexLimits(const TSourceLoc& /*loc*/, TIntermTyped* base, TIntermTyped* index)
{
    if ((! limits.generalSamplerIndexing && base->getBasicType() == EbtSampler) ||
        (! limits.generalUniformIndexing && base->getQualifier().isUniformOrBuffer() && language != EShLangVertex) ||
        (! limits.generalAttributeMatrixVectorIndexing && base->getQualifier().isPipeInput() && language == EShLangVertex && (base->getType().isMatrix() || base->getType().isVector())) ||
        (! limits.generalConstantMatrixVectorIndexing && base->getAsConstantUnion()) ||
        (! limits.generalVariableIndexing && ! base->getType().getQualifier().isUniformOrBuffer() &&
                                             ! base->getType().getQualifier().isPipeInput() &&
                                             ! base->getType().getQualifier().isPipeOutput() &&
                                             ! base->getType().getQualifier().isConstant()) ||
        (! limits.generalVaryingIndexing && (base->getType().getQualifier().isPipeInput() ||
                                                base->getType().getQualifier().isPipeOutput()))) {
        // it's too early to know what the inductive variables are, save it for post processing
        needsIndexLimitationChecking.push_back(index);
    }
}